

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_tri_collision.cpp
# Opt level: O1

uint __thiscall
GIM_TRIANGLE_CALCULATION_CACHE::clip_triangle
          (GIM_TRIANGLE_CALCULATION_CACHE *this,btVector4 *tri_plane,btVector3 *tripoints,
          btVector3 *srcpoints,btVector3 *clip_points)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btVector4 edgeplane;
  float local_40;
  float fStack_3c;
  float local_38;
  float local_34;
  
  fVar7 = tripoints[1].m_floats[0] - tripoints->m_floats[0];
  fVar4 = (tri_plane->super_btVector3).m_floats[0];
  fVar5 = (float)*(undefined8 *)(tripoints->m_floats + 1);
  fVar8 = (float)*(undefined8 *)(tripoints[1].m_floats + 1) - fVar5;
  fVar6 = (float)((ulong)*(undefined8 *)(tripoints->m_floats + 1) >> 0x20);
  fVar9 = (float)((ulong)*(undefined8 *)(tripoints[1].m_floats + 1) >> 0x20) - fVar6;
  uVar1 = *(undefined8 *)((tri_plane->super_btVector3).m_floats + 1);
  fVar10 = (float)uVar1;
  fVar11 = (float)((ulong)uVar1 >> 0x20);
  local_40 = fVar11 * fVar8 - fVar9 * fVar10;
  fStack_3c = fVar4 * fVar9 - fVar7 * fVar11;
  local_38 = fVar7 * fVar10 - fVar8 * fVar4;
  fVar7 = local_38 * local_38 + local_40 * local_40 + fStack_3c * fStack_3c;
  fVar4 = 3.4028235e+38;
  if (1e-07 < fVar7) {
    fVar4 = (float)(0x5f3759df - ((uint)fVar7 >> 1));
    fVar4 = (fVar7 * -0.5 * fVar4 * fVar4 + 1.5) * fVar4;
  }
  if (fVar4 < 3.4028235e+38) {
    local_38 = local_38 * fVar4;
    local_40 = local_40 * fVar4;
    fStack_3c = fStack_3c * fVar4;
  }
  local_34 = fVar6 * local_38 + tripoints->m_floats[0] * local_40 + fStack_3c * fVar5;
  uVar2 = PLANE_CLIP_TRIANGLE_GENERIC<btVector3,btVector4,DISTANCE_PLANE_3D_FUNC>
                    (&local_40,srcpoints,srcpoints + 1,srcpoints + 2,this->temp_points);
  uVar3 = 0;
  if (uVar2 != 0) {
    fVar7 = tripoints[2].m_floats[0] - tripoints[1].m_floats[0];
    fVar4 = (tri_plane->super_btVector3).m_floats[0];
    fVar5 = (float)*(undefined8 *)(tripoints[1].m_floats + 1);
    fVar8 = (float)*(undefined8 *)(tripoints[2].m_floats + 1) - fVar5;
    fVar6 = (float)((ulong)*(undefined8 *)(tripoints[1].m_floats + 1) >> 0x20);
    fVar9 = (float)((ulong)*(undefined8 *)(tripoints[2].m_floats + 1) >> 0x20) - fVar6;
    uVar1 = *(undefined8 *)((tri_plane->super_btVector3).m_floats + 1);
    fVar10 = (float)uVar1;
    fVar11 = (float)((ulong)uVar1 >> 0x20);
    local_40 = fVar11 * fVar8 - fVar9 * fVar10;
    fStack_3c = fVar4 * fVar9 - fVar7 * fVar11;
    local_38 = fVar7 * fVar10 - fVar8 * fVar4;
    fVar7 = local_38 * local_38 + local_40 * local_40 + fStack_3c * fStack_3c;
    fVar4 = 3.4028235e+38;
    if (1e-07 < fVar7) {
      fVar4 = (float)(0x5f3759df - ((uint)fVar7 >> 1));
      fVar4 = (fVar7 * -0.5 * fVar4 * fVar4 + 1.5) * fVar4;
    }
    if (fVar4 < 3.4028235e+38) {
      local_38 = local_38 * fVar4;
      local_40 = local_40 * fVar4;
      fStack_3c = fStack_3c * fVar4;
    }
    local_34 = fVar6 * local_38 + tripoints[1].m_floats[0] * local_40 + fStack_3c * fVar5;
    uVar2 = PLANE_CLIP_POLYGON_GENERIC<btVector3,btVector4,DISTANCE_PLANE_3D_FUNC>
                      (&local_40,this->temp_points,uVar2,this->temp_points1);
    uVar3 = 0;
    if (uVar2 != 0) {
      fVar7 = tripoints->m_floats[0] - tripoints[2].m_floats[0];
      fVar4 = (tri_plane->super_btVector3).m_floats[0];
      fVar5 = (float)*(undefined8 *)(tripoints[2].m_floats + 1);
      fVar8 = (float)*(undefined8 *)(tripoints->m_floats + 1) - fVar5;
      fVar6 = (float)((ulong)*(undefined8 *)(tripoints[2].m_floats + 1) >> 0x20);
      fVar9 = (float)((ulong)*(undefined8 *)(tripoints->m_floats + 1) >> 0x20) - fVar6;
      uVar1 = *(undefined8 *)((tri_plane->super_btVector3).m_floats + 1);
      fVar10 = (float)uVar1;
      fVar11 = (float)((ulong)uVar1 >> 0x20);
      local_40 = fVar11 * fVar8 - fVar9 * fVar10;
      fStack_3c = fVar4 * fVar9 - fVar7 * fVar11;
      local_38 = fVar7 * fVar10 - fVar8 * fVar4;
      fVar7 = local_38 * local_38 + local_40 * local_40 + fStack_3c * fStack_3c;
      fVar4 = 3.4028235e+38;
      if (1e-07 < fVar7) {
        fVar4 = (float)(0x5f3759df - ((uint)fVar7 >> 1));
        fVar4 = (fVar7 * -0.5 * fVar4 * fVar4 + 1.5) * fVar4;
      }
      if (fVar4 < 3.4028235e+38) {
        local_38 = local_38 * fVar4;
        local_40 = local_40 * fVar4;
        fStack_3c = fStack_3c * fVar4;
      }
      local_34 = fVar6 * local_38 + tripoints[2].m_floats[0] * local_40 + fStack_3c * fVar5;
      uVar3 = PLANE_CLIP_POLYGON_GENERIC<btVector3,btVector4,DISTANCE_PLANE_3D_FUNC>
                        (&local_40,this->temp_points1,uVar2,clip_points);
    }
  }
  return uVar3;
}

Assistant:

SIMD_FORCE_INLINE GUINT clip_triangle(
		const btVector4 & tri_plane,
		const btVector3 * tripoints,
		const btVector3 * srcpoints,
		btVector3 * clip_points)
	{
		// edge 0

		btVector4 edgeplane;

		EDGE_PLANE(tripoints[0],tripoints[1],tri_plane,edgeplane);

		GUINT clipped_count = PLANE_CLIP_TRIANGLE3D(
			edgeplane,srcpoints[0],srcpoints[1],srcpoints[2],temp_points);

		if(clipped_count == 0) return 0;

		// edge 1

		EDGE_PLANE(tripoints[1],tripoints[2],tri_plane,edgeplane);

		clipped_count = PLANE_CLIP_POLYGON3D(
			edgeplane,temp_points,clipped_count,temp_points1);

		if(clipped_count == 0) return 0;

		// edge 2

		EDGE_PLANE(tripoints[2],tripoints[0],tri_plane,edgeplane);

		clipped_count = PLANE_CLIP_POLYGON3D(
			edgeplane,temp_points1,clipped_count,clip_points);

		return clipped_count;


		/*GUINT i0 = (tri_plane.closestAxis()+1)%3;
		GUINT i1 = (i0+1)%3;
		// edge 0
		btVector3 temp_points[MAX_TRI_CLIPPING];
		btVector3 temp_points1[MAX_TRI_CLIPPING];

		GUINT clipped_count= PLANE_CLIP_TRIANGLE_GENERIC(
			0,srcpoints[0],srcpoints[1],srcpoints[2],temp_points,
			DISTANCE_EDGE(tripoints[0],tripoints[1],i0,i1));
		
		
		if(clipped_count == 0) return 0;

		// edge 1
		clipped_count = PLANE_CLIP_POLYGON_GENERIC(
			0,temp_points,clipped_count,temp_points1,
			DISTANCE_EDGE(tripoints[1],tripoints[2],i0,i1));

		if(clipped_count == 0) return 0;

		// edge 2
		clipped_count = PLANE_CLIP_POLYGON_GENERIC(
			0,temp_points1,clipped_count,clipped_points,
			DISTANCE_EDGE(tripoints[2],tripoints[0],i0,i1));

		return clipped_count;*/
	}